

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

void hexdump(char *p,char *ref,size_t l,size_t offset)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (p != (char *)0x0) {
    for (uVar2 = 0; uVar2 < l; uVar2 = uVar2 + 0x10) {
      logprintf("%04x",(ulong)(uint)((int)uVar2 + (int)offset));
      uVar5 = 0x20;
      lVar3 = 0;
      for (uVar1 = uVar2; (lVar3 != -0x10 && (uVar1 < l)); uVar1 = uVar1 + 1) {
        if (ref != (char *)0x0) {
          uVar4 = (uint)uVar5;
          if (p[uVar1] != ref[uVar1]) {
            uVar4 = 0x5f;
          }
          uVar5 = (ulong)uVar4;
        }
        logprintf("%c%02x",uVar5);
        if (ref != (char *)0x0) {
          uVar4 = (uint)uVar5;
          if (p[uVar1] == ref[uVar1]) {
            uVar4 = 0x20;
          }
          uVar5 = (ulong)uVar4;
        }
        lVar3 = lVar3 + -1;
      }
      for (uVar1 = -lVar3; uVar1 < 0x10; uVar1 = uVar1 + 1) {
        logprintf("%c  ",uVar5);
        uVar5 = 0x20;
      }
      logprintf("%c",uVar5);
      lVar3 = 0x10;
      for (uVar1 = uVar2; (bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6 && (uVar1 < l));
          uVar1 = uVar1 + 1) {
        if ((byte)(p[uVar1] - 0x20U) < 0x5f) {
          logprintf("%c");
        }
        else {
          logprintf(".");
        }
      }
      logprintf("\n");
    }
    return;
  }
  logprintf("(null)\n");
  return;
}

Assistant:

static void
hexdump(const char *p, const char *ref, size_t l, size_t offset)
{
	size_t i, j;
	char sep;

	if (p == NULL) {
		logprintf("(null)\n");
		return;
	}
	for(i=0; i < l; i+=16) {
		logprintf("%04x", (unsigned)(i + offset));
		sep = ' ';
		for (j = 0; j < 16 && i + j < l; j++) {
			if (ref != NULL && p[i + j] != ref[i + j])
				sep = '_';
			logprintf("%c%02x", sep, 0xff & (unsigned int)p[i+j]);
			if (ref != NULL && p[i + j] == ref[i + j])
				sep = ' ';
		}
		for (; j < 16; j++) {
			logprintf("%c  ", sep);
			sep = ' ';
		}
		logprintf("%c", sep);
		for (j=0; j < 16 && i + j < l; j++) {
			int c = p[i + j];
			if (c >= ' ' && c <= 126)
				logprintf("%c", c);
			else
				logprintf(".");
		}
		logprintf("\n");
	}
}